

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
copyChildNodesToNode
          (UA_Server *server,UA_Session *session,UA_NodeId *sourceNodeId,
          UA_NodeId *destinationNodeId,UA_InstantiationCallback *instantiationCallback)

{
  UA_Boolean UVar1;
  undefined1 local_170 [8];
  UA_AddReferencesItem newItem;
  UA_ReferenceDescription *rd;
  size_t i;
  UA_NodeId existingChild;
  undefined1 local_c0 [4];
  UA_StatusCode retval;
  UA_BrowseResult br;
  undefined1 local_80 [8];
  UA_BrowseDescription bd;
  UA_InstantiationCallback *instantiationCallback_local;
  UA_NodeId *destinationNodeId_local;
  UA_NodeId *sourceNodeId_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  bd._64_8_ = instantiationCallback;
  UA_BrowseDescription_init((UA_BrowseDescription *)local_80);
  local_80._0_2_ = sourceNodeId->namespaceIndex;
  local_80._2_2_ = *(undefined2 *)&sourceNodeId->field_0x2;
  local_80._4_4_ = sourceNodeId->identifierType;
  bd.nodeId._0_8_ = (sourceNodeId->identifier).string.length;
  bd.nodeId.identifier.string.length = (size_t)(sourceNodeId->identifier).string.data;
  UA_NODEID_NUMERIC((UA_NodeId *)&br.references,0,0x2c);
  bd._24_8_ = br.references;
  bd.referenceTypeId.identifier.guid.data4[0] = '\x01';
  bd.nodeId.identifier._8_4_ = 0;
  bd.referenceTypeId.identifier._12_4_ = 7;
  bd.includeSubtypes = true;
  bd._57_3_ = 0;
  UA_BrowseResult_init((UA_BrowseResult *)local_c0);
  Service_Browse_single
            (server,session,(ContinuationPointEntry *)0x0,(UA_BrowseDescription *)local_80,0,
             (UA_BrowseResult *)local_c0);
  if (local_c0 == (undefined1  [4])0x0) {
    existingChild.identifier._12_4_ = 0;
    i._0_2_ = 0;
    i._2_2_ = 0;
    i._4_4_ = UA_NODEIDTYPE_NUMERIC;
    existingChild.namespaceIndex = 0;
    existingChild._2_2_ = 0;
    existingChild.identifierType = UA_NODEIDTYPE_NUMERIC;
    existingChild.identifier.string.length = 0;
    for (rd = (UA_ReferenceDescription *)0x0; rd < br.continuationPoint.data;
        rd = (UA_ReferenceDescription *)((long)&(rd->referenceTypeId).namespaceIndex + 1)) {
      newItem._120_8_ = br.referencesSize + (long)rd * 0xc0;
      UVar1 = mandatoryChild(server,session,(UA_NodeId *)(newItem._120_8_ + 0x20));
      if (UVar1) {
        existingChild.identifier._12_4_ =
             instanceFindAggregateByBrowsename
                       (server,session,destinationNodeId,
                        (UA_QualifiedName *)(newItem._120_8_ + 0x50),(UA_NodeId *)&i);
        if (existingChild.identifier._12_4_ != 0) break;
        UVar1 = UA_NodeId_equal(&UA_NODEID_NULL,(UA_NodeId *)&i);
        if (UVar1) {
          if (*(int *)(newItem._120_8_ + 0x88) == 4) {
            UA_AddReferencesItem_init((UA_AddReferencesItem *)local_170);
            local_170._0_2_ = destinationNodeId->namespaceIndex;
            local_170._2_2_ = *(undefined2 *)&destinationNodeId->field_0x2;
            local_170._4_4_ = destinationNodeId->identifierType;
            newItem.sourceNodeId._0_8_ = (destinationNodeId->identifier).string.length;
            newItem.sourceNodeId.identifier.string.length =
                 (size_t)(destinationNodeId->identifier).string.data;
            newItem.sourceNodeId.identifier.string.data = (UA_Byte *)*(undefined8 *)newItem._120_8_;
            newItem.referenceTypeId._0_8_ = *(undefined8 *)(newItem._120_8_ + 8);
            newItem.referenceTypeId.identifier.string.length = *(size_t *)(newItem._120_8_ + 0x10);
            newItem.referenceTypeId.identifier.guid.data4[0] = '\x01';
            memcpy(&newItem.targetServerUri.data,(void *)(newItem._120_8_ + 0x20),0x30);
            newItem.targetNodeId.serverIndex = 4;
            existingChild.identifier._12_4_ =
                 addReference(server,session,(UA_AddReferencesItem *)local_170);
          }
          else if (*(int *)(newItem._120_8_ + 0x88) == 2) {
            existingChild.identifier._12_4_ =
                 copyExistingVariable
                           (server,session,(UA_NodeId *)(newItem._120_8_ + 0x20),
                            (UA_NodeId *)newItem._120_8_,destinationNodeId,
                            (UA_InstantiationCallback *)bd._64_8_);
          }
          else if (*(int *)(newItem._120_8_ + 0x88) == 1) {
            existingChild.identifier._12_4_ =
                 copyExistingObject(server,session,(UA_NodeId *)(newItem._120_8_ + 0x20),
                                    (UA_NodeId *)newItem._120_8_,destinationNodeId,
                                    (UA_InstantiationCallback *)bd._64_8_);
          }
        }
        else {
          if ((*(int *)(newItem._120_8_ + 0x88) != 4) &&
             (((*(int *)(newItem._120_8_ + 0x88) == 2 || (*(int *)(newItem._120_8_ + 0x88) == 1)) &&
              (UVar1 = UA_NodeId_equal((UA_NodeId *)(newItem._120_8_ + 0x20),(UA_NodeId *)&i),
              !UVar1)))) {
            existingChild.identifier._12_4_ =
                 copyChildNodesToNode
                           (server,session,(UA_NodeId *)(newItem._120_8_ + 0x20),(UA_NodeId *)&i,
                            (UA_InstantiationCallback *)bd._64_8_);
          }
          UA_NodeId_deleteMembers((UA_NodeId *)&i);
        }
        if (existingChild.identifier._12_4_ != 0) break;
      }
    }
    UA_BrowseResult_deleteMembers((UA_BrowseResult *)local_c0);
    server_local._4_4_ = existingChild.identifier._12_4_;
  }
  else {
    server_local._4_4_ = (UA_StatusCode)local_c0;
  }
  return server_local._4_4_;
}

Assistant:

static UA_StatusCode
copyChildNodesToNode(UA_Server* server, UA_Session* session,
                     const UA_NodeId* sourceNodeId, const UA_NodeId* destinationNodeId,
                     UA_InstantiationCallback* instantiationCallback) {
    /* Browse to get all children */
    UA_BrowseDescription bd;
    UA_BrowseDescription_init(&bd);
    bd.nodeId = *sourceNodeId;
    bd.referenceTypeId = UA_NODEID_NUMERIC(0, UA_NS0ID_AGGREGATES);
    bd.includeSubtypes = true;
    bd.browseDirection = UA_BROWSEDIRECTION_FORWARD;
    bd.nodeClassMask = UA_NODECLASS_OBJECT | UA_NODECLASS_VARIABLE | UA_NODECLASS_METHOD;
    bd.resultMask = UA_BROWSERESULTMASK_REFERENCETYPEID | UA_BROWSERESULTMASK_NODECLASS |
        UA_BROWSERESULTMASK_BROWSENAME;

    UA_BrowseResult br;
    UA_BrowseResult_init(&br);
    Service_Browse_single(server, session, NULL, &bd, 0, &br);
    if(br.statusCode != UA_STATUSCODE_GOOD)
        return br.statusCode;

    /* Copy all children */
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_NodeId existingChild = UA_NODEID_NULL;
    for(size_t i = 0; i < br.referencesSize; ++i) {
        UA_ReferenceDescription *rd = &br.references[i];

        /* Is the child mandatory? If not, skip */
        if(!mandatoryChild(server, session, &rd->nodeId.nodeId))
            continue;

        /* TODO: If a child is optional, check whether optional children that
         * were manually added fit the constraints. */

        /* Check for deduplication */
        retval = instanceFindAggregateByBrowsename(server, session, destinationNodeId,
                                                   &rd->browseName, &existingChild);
        if(retval != UA_STATUSCODE_GOOD)
            break;

        if(UA_NodeId_equal(&UA_NODEID_NULL, &existingChild)) {
            /* New node in child */
            if(rd->nodeClass == UA_NODECLASS_METHOD) {
                /* add a reference to the method in the objecttype */
                UA_AddReferencesItem newItem;
                UA_AddReferencesItem_init(&newItem);
                newItem.sourceNodeId = *destinationNodeId;
                newItem.referenceTypeId = rd->referenceTypeId;
                newItem.isForward = true;
                newItem.targetNodeId = rd->nodeId;
                newItem.targetNodeClass = UA_NODECLASS_METHOD;
                retval = addReference(server, session, &newItem);
            } else if(rd->nodeClass == UA_NODECLASS_VARIABLE)
                retval = copyExistingVariable(server, session, &rd->nodeId.nodeId,
                                              &rd->referenceTypeId, destinationNodeId,
                                              instantiationCallback);
            else if(rd->nodeClass == UA_NODECLASS_OBJECT)
                retval = copyExistingObject(server, session, &rd->nodeId.nodeId,
                                            &rd->referenceTypeId, destinationNodeId,
                                            instantiationCallback);
        } else {
            /* Preexistent node in child
             * General strategy if we meet an already existing node:
             * - Preexistent variable contents always 'win' overwriting anything
             *   supertypes would instantiate
             * - Always copy contents of template *into* existant node (merge
             *   contents of e.g. Folders like ParameterSet) */
            if(rd->nodeClass == UA_NODECLASS_METHOD) {
                /* Do nothing, existent method wins */
            } else if(rd->nodeClass == UA_NODECLASS_VARIABLE ||
                      rd->nodeClass == UA_NODECLASS_OBJECT) {
                if(!UA_NodeId_equal(&rd->nodeId.nodeId, &existingChild))
                    retval = copyChildNodesToNode(server, session, &rd->nodeId.nodeId,
                                                  &existingChild, instantiationCallback);
            }
            UA_NodeId_deleteMembers(&existingChild);
        }
        if(retval != UA_STATUSCODE_GOOD)
            break;
    }
    UA_BrowseResult_deleteMembers(&br);
    return retval;
}